

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall Omega_h::invert_marks(Omega_h *this,Read<signed_char> *marks)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  uint uVar3;
  LO size_in;
  Read<signed_char> RVar4;
  Write<signed_char> out;
  type f;
  Write<signed_char> local_a0;
  string local_90;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  Write<signed_char> local_30;
  
  pAVar1 = (marks->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    size_in = (LO)pAVar1->size;
  }
  else {
    size_in = (LO)((ulong)pAVar1 >> 3);
  }
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_60);
  Write<signed_char>::Write(&local_a0,size_in,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Write<signed_char>::Write(&local_40,&local_a0);
  Write<signed_char>::Write(&local_30,&marks->write_);
  if (((ulong)local_a0.shared_alloc_.alloc & 1) == 0) {
    uVar3 = (uint)(local_a0.shared_alloc_.alloc)->size;
  }
  else {
    uVar3 = (uint)((ulong)local_a0.shared_alloc_.alloc >> 3);
  }
  Write<signed_char>::Write(&local_60,&local_40);
  Write<signed_char>::Write(&local_50,&local_30);
  if (0 < (int)uVar3) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&local_90,&local_60);
    Write<signed_char>::Write((Write<signed_char> *)&local_90.field_2,&local_50);
    entering_parallel = 0;
    for (uVar2 = 0; (uVar3 & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
      *(bool *)(local_90._M_string_length + uVar2) =
           *(char *)(local_90.field_2._8_8_ + uVar2) == '\0';
    }
    invert_marks(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_90);
  }
  invert_marks(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_60);
  Write<signed_char>::Write(&local_70,&local_a0);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_70);
  Write<signed_char>::~Write(&local_70);
  invert_marks(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_40);
  Write<signed_char>::~Write(&local_a0);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> invert_marks(Read<I8> marks) {
  Write<I8> out(marks.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = !marks[i]; };
  parallel_for(out.size(), f, "invert_marks");
  return out;
}